

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::AssocArrayExistsMethod::checkArguments
          (AssocArrayExistsMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,1,1)
  ;
  if (bVar2) {
    pTVar3 = Type::getAssociativeIndexType(((*args->_M_ptr)->type).ptr);
    if (pTVar3 == (Type *)0x0) {
      bVar2 = Type::isIntegral((args->_M_ptr[1]->type).ptr);
      if (!bVar2) {
        pTVar3 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,args->_M_ptr[1]);
        return pTVar3;
      }
    }
    pTVar3 = pCVar1->intType;
  }
  else {
    pTVar3 = pCVar1->errorType;
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 1, 1))
            return comp.getErrorType();

        auto& type = *args[0]->type;
        auto indexType = type.getAssociativeIndexType();
        if (!indexType && !args[1]->type->isIntegral())
            return badArg(context, *args[1]);

        return comp.getIntType();
    }